

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeFactory.cpp
# Opt level: O2

QString * ExeFactory::getTypeName(exe_type type)

{
  iterator iVar1;
  mapped_type *ppEVar2;
  EVP_PKEY_CTX *in_RDI;
  key_type local_1c;
  
  init(in_RDI);
  iVar1 = std::
          _Rb_tree<ExeFactory::exe_type,_std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>,_std::_Select1st<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
          ::find(&builders._M_t,&local_1c);
  if ((_Rb_tree_header *)iVar1._M_node != &builders._M_t._M_impl.super__Rb_tree_header) {
    ppEVar2 = std::
              map<ExeFactory::exe_type,_ExeBuilder_*,_std::less<ExeFactory::exe_type>,_std::allocator<std::pair<const_ExeFactory::exe_type,_ExeBuilder_*>_>_>
              ::operator[](&builders,&local_1c);
    if (*ppEVar2 != (mapped_type)0x0) {
      (*(*ppEVar2)->_vptr_ExeBuilder[4])();
      return (QString *)in_RDI;
    }
  }
  QString::QString((QString *)in_RDI,"Not supported");
  return (QString *)in_RDI;
}

Assistant:

QString ExeFactory::getTypeName(exe_type type)
{
    ExeFactory::init(); //ensue that the builders are initialized

    if (builders.find(type) == builders.end()) return "Not supported";

    ExeBuilder* builder = builders[type];
    if (builder == NULL) return "Not supported";

    return builder->typeName();
}